

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Expression * __thiscall hdc::Parser::parse_term_expression(Parser *this)

{
  bool bVar1;
  Expression *left;
  Expression *pEVar2;
  Expression *pEVar3;
  Token oper;
  
  oper.lexem._M_dataplus._M_p = (pointer)&oper.lexem.field_2;
  oper.lexem._M_string_length = 0;
  oper.lexem.field_2._M_local_buf[0] = '\0';
  left = parse_bitwise_or_expression(this);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          bVar1 = match(this,TK_TIMES);
          if (!bVar1) break;
          Token::operator=(&oper,(this->matched)._M_current);
          pEVar2 = (Expression *)operator_new(0x68);
          pEVar3 = parse_bitwise_or_expression(this);
          TimesExpression::TimesExpression((TimesExpression *)pEVar2,&oper,left,pEVar3);
          left = pEVar2;
        }
        bVar1 = match(this,TK_DIVISION);
        if (!bVar1) break;
        Token::operator=(&oper,(this->matched)._M_current);
        pEVar2 = (Expression *)operator_new(0x68);
        pEVar3 = parse_bitwise_or_expression(this);
        DivisionExpression::DivisionExpression((DivisionExpression *)pEVar2,&oper,left,pEVar3);
        left = pEVar2;
      }
      bVar1 = match(this,TK_INTEGER_DIVISION);
      if (!bVar1) break;
      Token::operator=(&oper,(this->matched)._M_current);
      pEVar2 = (Expression *)operator_new(0x68);
      pEVar3 = parse_bitwise_or_expression(this);
      IntegerDivisionExpression::IntegerDivisionExpression
                ((IntegerDivisionExpression *)pEVar2,&oper,left,pEVar3);
      left = pEVar2;
    }
    bVar1 = match(this,TK_MODULO);
    if (!bVar1) break;
    Token::operator=(&oper,(this->matched)._M_current);
    pEVar2 = (Expression *)operator_new(0x68);
    pEVar3 = parse_bitwise_or_expression(this);
    ModuloExpression::ModuloExpression((ModuloExpression *)pEVar2,&oper,left,pEVar3);
    left = pEVar2;
  }
  std::__cxx11::string::~string((string *)&oper.lexem);
  return left;
}

Assistant:

Expression* Parser::parse_term_expression() {
    Token oper;
    Expression* expression = parse_bitwise_or_expression();

    while (true) {
        if (match(TK_TIMES)) {
            oper = *matched;
            expression = new TimesExpression(oper, expression, parse_bitwise_or_expression());
        } else if (match(TK_DIVISION)) {
            oper = *matched;
            expression = new DivisionExpression(oper, expression, parse_bitwise_or_expression());
        } else if (match(TK_INTEGER_DIVISION)) {
            oper = *matched;
            expression = new IntegerDivisionExpression(oper, expression, parse_bitwise_or_expression());
        } else if (match(TK_MODULO)) {
            oper = *matched;
            expression = new ModuloExpression(oper, expression, parse_bitwise_or_expression());
        } else {
            break;
        }
    }

    return expression;
}